

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O2

void arp_print(void)

{
  arp_list_entry_t *paVar1;
  long lVar2;
  arp_list_entry_t **ppaVar3;
  
  csp_print_func("ARP  CSP  MAC\n");
  ppaVar3 = &arp_list;
  while (paVar1 = *ppaVar3, paVar1 != (arp_list_entry_t *)0x0) {
    csp_print_func("     %3u  ",(ulong)paVar1->csp_addr);
    for (lVar2 = 2; lVar2 != 8; lVar2 = lVar2 + 1) {
      csp_print_func("%02x ",(ulong)paVar1->mac_addr[lVar2 + -2]);
    }
    ppaVar3 = &paVar1->next;
  }
  csp_print_func("\n");
  return;
}

Assistant:

void arp_print()
{
    csp_print("ARP  CSP  MAC\n");
    for (arp_list_entry_t * arp = arp_list; arp; arp = arp->next) {
        csp_print("     %3u  ", (unsigned)(arp->csp_addr));
        for (int i = 0; i < CSP_ETH_ALEN; ++i) {
            csp_print("%02x ", arp->mac_addr[i]);
        }
    }
    csp_print("\n");
}